

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactorTable.hpp
# Opt level: O3

int64_t primesum::FactorTable<unsigned_short>::next_multiple
                  (int64_t prime,int64_t low,int64_t *index)

{
  ulong uVar1;
  int64_t iVar2;
  
  uVar1 = (prime + low + -1) / prime;
  uVar1 = (long)(char)(&AbstractFactorTable::indexes_)[uVar1 % 0xd2] + (uVar1 / 0xd2) * 0x30;
  if ((long)uVar1 < *index) {
    uVar1 = *index;
  }
  if (low < 0) {
    iVar2 = 0;
  }
  else {
    do {
      iVar2 = ((ulong)(byte)AbstractFactorTable::numbers_[uVar1 % 0x30] + (uVar1 / 0x30) * 0xd2) *
              prime;
      uVar1 = uVar1 + 1;
    } while (iVar2 - low == 0 || iVar2 < low);
  }
  *index = uVar1;
  return iVar2;
}

Assistant:

static int64_t next_multiple(int64_t prime,
                               int64_t low,
                               int64_t* index)
  {
    int64_t quotient = ceil_div(low, prime);
    int64_t i = std::max(*index, get_index(quotient));
    int64_t multiple = 0;

    for (; multiple <= low; i++)
      multiple = prime * get_number(i);

    *index = i;
    return multiple;
  }